

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O3

void __thiscall
jsonnet::internal::RuntimeError::RuntimeError
          (RuntimeError *this,
          vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
          *stack_trace,string *msg)

{
  pointer pcVar1;
  
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            (&this->stackTrace,stack_trace);
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

RuntimeError(const std::vector<TraceFrame> stack_trace, const std::string &msg)
        : stackTrace(stack_trace), msg(msg)
    {
    }